

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O2

void __thiscall egc::Sequencer::DCA(Sequencer *this,unsigned_short instruction)

{
  unsigned_short word;
  unsigned_short word_00;
  ostream *poVar1;
  ushort address;
  ushort address_00;
  
  address_00 = instruction & 0x3ff;
  address = address_00 - 1;
  poVar1 = std::operator<<((ostream *)&std::cout,"DCA");
  poVar1 = std::operator<<(poVar1," ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,address);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar1);
  word = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,address_00,0);
  word_00 = Memory::Read((this->m_Memory).
                         super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,address,
                         0);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address_00,word);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address,word_00);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                1,word);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                0,word_00);
  return;
}

Assistant:

void egc::Sequencer::DCA (unsigned short instruction)
{
    unsigned short k = (instruction & 001777u) - 000001u;

    std::cout << "DCA" << " " << std::oct << k << std::dec << std::endl;

    auto mkLow = m_Memory->Read(k + 00001u);
    auto mkHigh = m_Memory->Read(k);

    m_Memory->Write(k + 00001u, mkLow);
    m_Memory->Write(k, mkHigh);
    m_Memory->Write(00001u, mkLow);
    m_Memory->Write(00000u, mkHigh);
}